

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::ParseInfo::Deserialize(ParseInfo *this,Deserializer *deserializer)

{
  ParseInfoType PVar1;
  SerializationException *this_00;
  allocator local_41;
  _Alloc_hider local_40;
  
  PVar1 = Deserializer::ReadProperty<duckdb::ParseInfoType>(deserializer,100,"info_type");
  this->_vptr_ParseInfo = (_func_int **)0x0;
  switch(PVar1) {
  case ALTER_INFO:
    AlterInfo::Deserialize((AlterInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case ATTACH_INFO:
    AttachInfo::Deserialize((AttachInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case COPY_INFO:
    CopyInfo::Deserialize((CopyInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc0,
               "Unsupported type for deserialization of ParseInfo!",&local_41);
    SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffffc0);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case DETACH_INFO:
    DetachInfo::Deserialize((DetachInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case DROP_INFO:
    DropInfo::Deserialize((DropInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case BOUND_EXPORT_DATA:
    BoundExportData::Deserialize((BoundExportData *)&stack0xffffffffffffffc0,deserializer);
    break;
  case LOAD_INFO:
    LoadInfo::Deserialize((LoadInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case PRAGMA_INFO:
    PragmaInfo::Deserialize((PragmaInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case TRANSACTION_INFO:
    TransactionInfo::Deserialize((TransactionInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case VACUUM_INFO:
    VacuumInfo::Deserialize((VacuumInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case COPY_DATABASE_INFO:
    CopyDatabaseInfo::Deserialize((CopyDatabaseInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case UPDATE_EXTENSIONS_INFO:
    UpdateExtensionsInfo::Deserialize((UpdateExtensionsInfo *)&stack0xffffffffffffffc0,deserializer)
    ;
  }
  this->_vptr_ParseInfo = (_func_int **)local_40._M_p;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> ParseInfo::Deserialize(Deserializer &deserializer) {
	auto info_type = deserializer.ReadProperty<ParseInfoType>(100, "info_type");
	unique_ptr<ParseInfo> result;
	switch (info_type) {
	case ParseInfoType::ALTER_INFO:
		result = AlterInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::ATTACH_INFO:
		result = AttachInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::BOUND_EXPORT_DATA:
		result = BoundExportData::Deserialize(deserializer);
		break;
	case ParseInfoType::COPY_DATABASE_INFO:
		result = CopyDatabaseInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::COPY_INFO:
		result = CopyInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::DETACH_INFO:
		result = DetachInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::DROP_INFO:
		result = DropInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::LOAD_INFO:
		result = LoadInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::PRAGMA_INFO:
		result = PragmaInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::TRANSACTION_INFO:
		result = TransactionInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::UPDATE_EXTENSIONS_INFO:
		result = UpdateExtensionsInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::VACUUM_INFO:
		result = VacuumInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ParseInfo!");
	}
	return result;
}